

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O2

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  IMutableContext *pIVar1;
  ostream *poVar2;
  int iVar3;
  Session *this_00;
  Colour local_d1;
  undefined1 local_d0 [56];
  string local_98;
  InternalParseResult result;
  
  if (this->m_startupExceptions == false) {
    clara::detail::Args::Args((Args *)local_d0,argc,argv);
    clara::detail::ParserBase::parse(&result,&(this->m_cli).super_ParserBase,(Args *)local_d0);
    this_00 = (Session *)local_d0;
    clara::detail::Args::~Args((Args *)this_00);
    if (result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.m_type == Ok
       ) {
      if ((this->m_configData).showHelp == true) {
        this_00 = this;
        showHelp(this);
      }
      if ((this->m_configData).libIdentify == true) {
        libIdentify(this_00);
      }
      clara::std::__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
      iVar3 = 0;
    }
    else {
      config(this);
      pIVar1 = getCurrentMutableContext();
      std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Catch::Config,void>
                ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)local_d0,
                 &(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
      (*(pIVar1->super_IContext)._vptr_IContext[7])
                (pIVar1,(__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)local_d0);
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
      local_d1.m_moved = false;
      Colour::use(Red);
      poVar2 = std::operator<<((ostream *)&std::cerr,"\nError(s) in input:\n");
      std::__cxx11::string::string((string *)(local_d0 + 0x38),(string *)&result.m_errorMessage);
      clara::TextFlow::Column::Column((Column *)local_d0,(string *)(local_d0 + 0x38));
      local_d0._32_8_ = (pointer)0x2;
      poVar2 = clara::TextFlow::operator<<(poVar2,(Column *)local_d0);
      std::operator<<(poVar2,"\n\n");
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d0);
      std::__cxx11::string::~string((string *)(local_d0 + 0x38));
      Colour::~Colour(&local_d1);
      poVar2 = std::operator<<((ostream *)&std::cerr,"Run with -? for usage\n");
      iVar3 = 0xff;
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    clara::detail::BasicResult<Catch::clara::detail::ParseState>::~BasicResult(&result);
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( clara::Args( argc, argv ) );
        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config);
            Catch::cerr()
                << Colour( Colour::Red )
                << "\nError(s) in input:\n"
                << Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            Catch::cerr() << "Run with -? for usage\n" << std::endl;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();
        m_config.reset();
        return 0;
    }